

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableGcCompactSettings(void)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  char *__dest;
  ImGuiTableSettings *__dest_00;
  int *piVar4;
  char *pcVar5;
  uint uVar6;
  ImVector<char> local_38;
  
  pIVar2 = GImGui;
  pcVar5 = (GImGui->SettingsTables).Buf.Data;
  uVar1 = (GImGui->SettingsTables).Buf.Size;
  if (pcVar5 == (char *)0x0) {
    if (uVar1 == 0) {
      return;
    }
    local_38.Size = 0;
    local_38.Capacity = 0;
    uVar6 = 0;
    local_38.Data = (char *)0x0;
  }
  else {
    piVar4 = (int *)(pcVar5 + 4);
    uVar6 = 0;
    do {
      if (*piVar4 != 0) {
        uVar6 = uVar6 + (char)piVar4[3] * 0xc + 0x10;
      }
      piVar4 = (int *)((long)piVar4 + (long)piVar4[-1]);
    } while (piVar4 != (int *)(pcVar5 + (long)(int)uVar1 + 4));
    if (uVar6 == uVar1) {
      return;
    }
    local_38.Size = 0;
    local_38.Capacity = 0;
    local_38.Data = (char *)0x0;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    else {
      __dest = (char *)MemAlloc((ulong)uVar6);
      pcVar5 = local_38.Data;
      if (local_38.Data != (char *)0x0) {
        memcpy(__dest,local_38.Data,(long)local_38.Size);
        MemFree(pcVar5);
      }
      local_38.Capacity = uVar6;
      pcVar5 = (pIVar2->SettingsTables).Buf.Data;
      local_38.Data = __dest;
    }
    if (pcVar5 != (char *)0x0) {
      piVar4 = (int *)(pcVar5 + 4);
      do {
        if (*piVar4 != 0) {
          __dest_00 = ImChunkStream<ImGuiTableSettings>::alloc_chunk
                                ((ImChunkStream<ImGuiTableSettings> *)&local_38,
                                 (long)(char)piVar4[3] * 0xc + 0x10);
          memcpy(__dest_00,piVar4,(long)(char)piVar4[3] * 0xc + 0x10);
          pcVar5 = (pIVar2->SettingsTables).Buf.Data;
        }
        piVar4 = (int *)((long)piVar4 + (long)piVar4[-1]);
        iVar3 = (pIVar2->SettingsTables).Buf.Size;
      } while (piVar4 != (int *)(pcVar5 + (long)iVar3 + 4));
      uVar6 = local_38.Capacity;
      goto LAB_00162b7d;
    }
  }
  iVar3 = (pIVar2->SettingsTables).Buf.Size;
  pcVar5 = (char *)0x0;
LAB_00162b7d:
  (pIVar2->SettingsTables).Buf.Size = local_38.Size;
  local_38.Capacity = (pIVar2->SettingsTables).Buf.Capacity;
  (pIVar2->SettingsTables).Buf.Capacity = uVar6;
  local_38.Size = iVar3;
  (pIVar2->SettingsTables).Buf.Data = local_38.Data;
  if (pcVar5 != (char *)0x0) {
    local_38.Data = pcVar5;
    MemFree(pcVar5);
  }
  return;
}

Assistant:

void ImGui::TableGcCompactSettings()
{
    ImGuiContext& g = *GImGui;
    int required_memory = 0;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            required_memory += (int)TableSettingsCalcChunkSize(settings->ColumnsCount);
    if (required_memory == g.SettingsTables.Buf.Size)
        return;
    ImChunkStream<ImGuiTableSettings> new_chunk_stream;
    new_chunk_stream.Buf.reserve(required_memory);
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            memcpy(new_chunk_stream.alloc_chunk(TableSettingsCalcChunkSize(settings->ColumnsCount)), settings, TableSettingsCalcChunkSize(settings->ColumnsCount));
    g.SettingsTables.swap(new_chunk_stream);
}